

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

int __thiscall gl4cts::ShaderSubroutine::Utils::program::remove(program *this,char *__filename)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  program *ppVar4;
  Functions *gl;
  program *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext(this->m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0x1680))(0);
  if (this->m_program_object_id != 0) {
    (**(code **)(lVar3 + 0x448))(this->m_program_object_id);
    this->m_program_object_id = 0;
  }
  if (this->m_compute_shader_id != 0) {
    (**(code **)(lVar3 + 0x470))(this->m_compute_shader_id);
    this->m_compute_shader_id = 0;
  }
  if (this->m_fragment_shader_id != 0) {
    (**(code **)(lVar3 + 0x470))(this->m_fragment_shader_id);
    this->m_fragment_shader_id = 0;
  }
  if (this->m_geometry_shader_id != 0) {
    (**(code **)(lVar3 + 0x470))(this->m_geometry_shader_id);
    this->m_geometry_shader_id = 0;
  }
  if (this->m_tesselation_control_shader_id != 0) {
    (**(code **)(lVar3 + 0x470))(this->m_tesselation_control_shader_id);
    this->m_tesselation_control_shader_id = 0;
  }
  if (this->m_tesselation_evaluation_shader_id != 0) {
    (**(code **)(lVar3 + 0x470))(this->m_tesselation_evaluation_shader_id);
    this->m_tesselation_evaluation_shader_id = 0;
  }
  ppVar4 = (program *)0x0;
  if (this->m_vertex_shader_id != 0) {
    (**(code **)(lVar3 + 0x470))(this->m_vertex_shader_id);
    this->m_vertex_shader_id = 0;
    ppVar4 = this;
  }
  return (int)ppVar4;
}

Assistant:

void Utils::program::remove()
{
	/* GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Make sure program object is no longer used by GL */
	gl.useProgram(0);

	/* Clean program object */
	if (0 != m_program_object_id)
	{
		gl.deleteProgram(m_program_object_id);
		m_program_object_id = 0;
	}

	/* Clean shaders */
	if (0 != m_compute_shader_id)
	{
		gl.deleteShader(m_compute_shader_id);
		m_compute_shader_id = 0;
	}

	if (0 != m_fragment_shader_id)
	{
		gl.deleteShader(m_fragment_shader_id);
		m_fragment_shader_id = 0;
	}

	if (0 != m_geometry_shader_id)
	{
		gl.deleteShader(m_geometry_shader_id);
		m_geometry_shader_id = 0;
	}

	if (0 != m_tesselation_control_shader_id)
	{
		gl.deleteShader(m_tesselation_control_shader_id);
		m_tesselation_control_shader_id = 0;
	}

	if (0 != m_tesselation_evaluation_shader_id)
	{
		gl.deleteShader(m_tesselation_evaluation_shader_id);
		m_tesselation_evaluation_shader_id = 0;
	}

	if (0 != m_vertex_shader_id)
	{
		gl.deleteShader(m_vertex_shader_id);
		m_vertex_shader_id = 0;
	}
}